

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> *
draco::CreateMeshDecoder
          (StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
           *__return_storage_ptr__,uint8_t method)

{
  MeshEdgebreakerDecoder *this;
  int iVar1;
  undefined7 in_register_00000031;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [40];
  
  iVar1 = (int)CONCAT71(in_register_00000031,method);
  if (iVar1 == 1) {
    this = (MeshEdgebreakerDecoder *)operator_new(0x68);
    MeshEdgebreakerDecoder::MeshEdgebreakerDecoder(this);
  }
  else {
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_58,"Unsupported encoding method.",&local_59);
      local_38._0_4_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)(local_38 + 8),local_58);
      StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)local_38);
      std::__cxx11::string::~string((string *)(local_38 + 8));
      std::__cxx11::string::~string(local_58);
      return __return_storage_ptr__;
    }
    this = (MeshEdgebreakerDecoder *)operator_new(0x60);
    MeshSequentialDecoder::MeshSequentialDecoder((MeshSequentialDecoder *)this);
  }
  (__return_storage_ptr__->status_).code_ = OK;
  (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
  (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
  (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_t.
  super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
  super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
  super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl = &this->super_MeshDecoder;
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<MeshDecoder>> CreateMeshDecoder(uint8_t method) {
  if (method == MESH_SEQUENTIAL_ENCODING) {
    return std::unique_ptr<MeshDecoder>(new MeshSequentialDecoder());
  } else if (method == MESH_EDGEBREAKER_ENCODING) {
    return std::unique_ptr<MeshDecoder>(new MeshEdgebreakerDecoder());
  }
  return Status(Status::DRACO_ERROR, "Unsupported encoding method.");
}